

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::noteGlobalClocking
          (Compilation *this,Scope *scope,Symbol *clocking,SourceRange range)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  int iVar6;
  undefined1 auVar7 [16];
  SourceRange sourceRange;
  ulong pos0;
  Diagnostic *this_00;
  pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*> *ppVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong hash;
  pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*> *ppVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  undefined1 auVar18 [16];
  try_emplace_args_t local_79;
  flat_hash_map<const_Scope_*,_const_Symbol_*> *local_78;
  Symbol *local_70;
  Scope *local_68;
  ulong local_60;
  SourceLocation local_58;
  SourceLocation local_50;
  locator res;
  
  local_50 = range.endLoc;
  local_58 = range.startLoc;
  local_78 = &this->globalClockingMap;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = scope;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->globalClockingMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->globalClockingMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar5 = (this->globalClockingMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
           .arrays.elements_;
  local_60 = (this->globalClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.groups_size_mask;
  uVar10 = 0;
  uVar12 = pos0;
  do {
    pgVar1 = pgVar4 + uVar12;
    uVar14 = (uchar)uVar3;
    auVar18[0] = -(pgVar1->m[0].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 8);
    auVar18[1] = -(pgVar1->m[1].n == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x10);
    auVar18[2] = -(pgVar1->m[2].n == uVar16);
    uVar17 = (uchar)((uint)uVar3 >> 0x18);
    auVar18[3] = -(pgVar1->m[3].n == uVar17);
    auVar18[4] = -(pgVar1->m[4].n == uVar14);
    auVar18[5] = -(pgVar1->m[5].n == uVar15);
    auVar18[6] = -(pgVar1->m[6].n == uVar16);
    auVar18[7] = -(pgVar1->m[7].n == uVar17);
    auVar18[8] = -(pgVar1->m[8].n == uVar14);
    auVar18[9] = -(pgVar1->m[9].n == uVar15);
    auVar18[10] = -(pgVar1->m[10].n == uVar16);
    auVar18[0xb] = -(pgVar1->m[0xb].n == uVar17);
    auVar18[0xc] = -(pgVar1->m[0xc].n == uVar14);
    auVar18[0xd] = -(pgVar1->m[0xd].n == uVar15);
    auVar18[0xe] = -(pgVar1->m[0xe].n == uVar16);
    auVar18[0xf] = -(pgVar1->m[0xf].n == uVar17);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      iVar6 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (*(Scope **)((long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4)) == scope) {
        ppVar8 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*> *)
                 ((long)&ppVar5[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4));
        goto LAB_00144cd5;
      }
    }
    if ((pgVar4[uVar12].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    lVar11 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar11 + 1U & local_60;
  } while (uVar10 <= local_60);
  ppVar8 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*> *)0x0;
LAB_00144cd5:
  ppVar13 = ppVar8;
  local_70 = clocking;
  local_68 = scope;
  if (ppVar8 == (pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*> *)0x0) {
    if ((this->globalClockingMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
        .size_ctrl.size <
        (this->globalClockingMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Symbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*,slang::ast::Symbol_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Symbol_const*>>>
                       *)local_78,(arrays_type *)local_78,pos0,hash,&local_79,&local_68,&local_70);
      psVar2 = &(this->globalClockingMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
                .size_ctrl.size;
      *psVar2 = *psVar2 + 1;
      ppVar13 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Symbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*,slang::ast::Symbol_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,slang::ast::Symbol_const*>>>
                       *)local_78,hash,&local_79,&local_68,&local_70);
      ppVar13 = res.p;
    }
  }
  if (ppVar8 != (pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*> *)0x0) {
    sourceRange.endLoc = local_50;
    sourceRange.startLoc = local_58;
    this_00 = Scope::addDiag(scope,(DiagCode)0x17000d,sourceRange);
    Diagnostic::addNote(this_00,(DiagCode)0xa0001,ppVar13->second->location);
  }
  return;
}

Assistant:

void Compilation::noteGlobalClocking(const Scope& scope, const Symbol& clocking,
                                     SourceRange range) {
    SLANG_ASSERT(!isFrozen());

    auto [it, inserted] = globalClockingMap.emplace(&scope, &clocking);
    if (!inserted) {
        auto& diag = scope.addDiag(diag::MultipleGlobalClocking, range);
        diag.addNote(diag::NotePreviousDefinition, it->second->location);
    }
}